

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

size_t __thiscall
kj::BufferedInputStreamWrapper::tryRead
          (BufferedInputStreamWrapper *this,void *dst,size_t minBytes,size_t maxBytes)

{
  InputStream *this_00;
  BufferedInputStreamWrapper *start;
  size_t sVar1;
  unsigned_long *puVar2;
  uchar *puVar3;
  size_t sVar4;
  ulong uVar5;
  ssize_t sVar6;
  ArrayPtr<unsigned_char> AVar7;
  ArrayPtr<unsigned_char> local_88;
  uchar *local_78;
  size_t local_70;
  size_t local_68;
  size_t fromSecondBuffer;
  size_t n_1;
  size_t fromFirstBuffer;
  size_t local_48;
  size_t local_40;
  BufferedInputStreamWrapper *local_38;
  size_t n;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *dst_local;
  BufferedInputStreamWrapper *this_local;
  
  n = maxBytes;
  maxBytes_local = minBytes;
  minBytes_local = (size_t)dst;
  dst_local = this;
  sVar1 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
  sVar4 = minBytes_local;
  if (sVar1 < minBytes) {
    puVar3 = ArrayPtr<unsigned_char>::begin(&this->bufferAvailable);
    sVar1 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
    memcpy((void *)sVar4,puVar3,sVar1);
    n_1 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
    minBytes_local = minBytes_local + n_1;
    maxBytes_local = maxBytes_local - n_1;
    uVar5 = n - n_1;
    n = uVar5;
    sVar4 = ArrayPtr<unsigned_char>::size(&this->buffer);
    if (sVar4 < uVar5) {
      ArrayPtr<unsigned_char>::ArrayPtr(&local_88,(void *)0x0);
      sVar4 = n_1;
      (this->bufferAvailable).ptr = local_88.ptr;
      (this->bufferAvailable).size_ = local_88.size_;
      sVar6 = InputStream::read(this->inner,(int)minBytes_local,(void *)maxBytes_local,n);
      this_local = (BufferedInputStreamWrapper *)(sVar4 + sVar6);
    }
    else {
      this_00 = this->inner;
      puVar3 = ArrayPtr<unsigned_char>::begin(&this->buffer);
      sVar4 = maxBytes_local;
      sVar1 = ArrayPtr<unsigned_char>::size(&this->buffer);
      fromSecondBuffer = InputStream::read(this_00,(int)puVar3,(void *)sVar4,sVar1);
      puVar2 = std::min<unsigned_long>(&fromSecondBuffer,&n);
      sVar4 = minBytes_local;
      local_68 = *puVar2;
      puVar3 = ArrayPtr<unsigned_char>::begin(&this->buffer);
      memcpy((void *)sVar4,puVar3,local_68);
      AVar7 = ArrayPtr<unsigned_char>::slice(&this->buffer,local_68,fromSecondBuffer);
      local_78 = AVar7.ptr;
      (this->bufferAvailable).ptr = local_78;
      local_70 = AVar7.size_;
      (this->bufferAvailable).size_ = local_70;
      this_local = (BufferedInputStreamWrapper *)(n_1 + local_68);
    }
  }
  else {
    local_40 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
    puVar2 = std::min<unsigned_long>(&local_40,&n);
    sVar4 = minBytes_local;
    local_38 = (BufferedInputStreamWrapper *)*puVar2;
    puVar3 = ArrayPtr<unsigned_char>::begin(&this->bufferAvailable);
    memcpy((void *)sVar4,puVar3,(size_t)local_38);
    start = local_38;
    sVar4 = ArrayPtr<unsigned_char>::size(&this->bufferAvailable);
    AVar7 = ArrayPtr<unsigned_char>::slice(&this->bufferAvailable,(size_t)start,sVar4);
    fromFirstBuffer = (size_t)AVar7.ptr;
    (this->bufferAvailable).ptr = (uchar *)fromFirstBuffer;
    local_48 = AVar7.size_;
    (this->bufferAvailable).size_ = local_48;
    this_local = local_38;
  }
  return (size_t)this_local;
}

Assistant:

size_t BufferedInputStreamWrapper::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  if (minBytes <= bufferAvailable.size()) {
    // Serve from current buffer.
    size_t n = std::min(bufferAvailable.size(), maxBytes);
    memcpy(dst, bufferAvailable.begin(), n);
    bufferAvailable = bufferAvailable.slice(n, bufferAvailable.size());
    return n;
  } else {
    // Copy current available into destination.
    memcpy(dst, bufferAvailable.begin(), bufferAvailable.size());
    size_t fromFirstBuffer = bufferAvailable.size();

    dst = reinterpret_cast<byte*>(dst) + fromFirstBuffer;
    minBytes -= fromFirstBuffer;
    maxBytes -= fromFirstBuffer;

    if (maxBytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer.begin(), minBytes, buffer.size());
      size_t fromSecondBuffer = std::min(n, maxBytes);
      memcpy(dst, buffer.begin(), fromSecondBuffer);
      bufferAvailable = buffer.slice(fromSecondBuffer, n);
      return fromFirstBuffer + fromSecondBuffer;
    } else {
      // Forward large read to the underlying stream.
      bufferAvailable = nullptr;
      return fromFirstBuffer + inner.read(dst, minBytes, maxBytes);
    }
  }
}